

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# road_network.cpp
# Opt level: O1

bool __thiscall road_network::is_inner(road_network *this,node_type n)

{
  return (n - P0 & 0xf9) == 0;
}

Assistant:

bool road_network::is_inner(node_type n)
{
    switch (n)
    {
        case node_type::P0:
            return true;
        case node_type::P1:
            return true;
        case node_type::P2:
            return true;
        case node_type::P3:
            return true;
        default:
            return false;
    }
}